

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForField
          (Generator *this,FieldDescriptor *field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Descriptor *pDVar2;
  int iVar3;
  LogMessage *other;
  _Alloc_hider _Var4;
  string field_name;
  string field_options;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  undefined1 *local_88 [2];
  int local_78 [10];
  string local_50;
  
  MessageLite::SerializeAsString_abi_cxx11_((string *)local_88,*(MessageLite **)(field + 0x38));
  OptionsValue(&local_50,this,(string *)local_88);
  if ((int *)local_88[0] != &((LogMessage *)local_88)->line_) {
    operator_delete(local_88[0]);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar3 == 0) goto LAB_002905e3;
  paVar1 = &local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  if (((byte)field[1] & 8) == 0) {
    pDVar2 = *(Descriptor **)(field + 0x20);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"fields_by_name","");
    FieldReferencingExpression((string *)local_88,this,pDVar2,field,&local_e8);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)local_88);
    if ((int *)local_88[0] != &((LogMessage *)local_88)->line_) {
      operator_delete(local_88[0]);
    }
    _Var4._M_p = local_e8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
LAB_00290594:
      operator_delete(_Var4._M_p);
    }
  }
  else if (*(long *)(field + 0x28) == 0) {
    std::__cxx11::string::_M_assign((string *)&local_c8);
  }
  else {
    if (((byte)field[1] & 8) == 0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.h"
                 ,0x8d0);
      other = internal::LogMessage::operator<<
                        ((LogMessage *)local_88,"CHECK failed: is_extension_: ");
      internal::LogFinisher::operator=((LogFinisher *)&local_a8,other);
      internal::LogMessage::~LogMessage((LogMessage *)local_88);
    }
    pDVar2 = *(Descriptor **)(field + 0x28);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"extensions_by_name","");
    FieldReferencingExpression(&local_e8,this,pDVar2,field,&local_a8);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    _Var4._M_p = local_a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) goto LAB_00290594;
  }
  io::Printer::Print<char[11],std::__cxx11::string,char[17],std::__cxx11::string>
            (this->printer_,
             "$descriptor$._options = None\n$descriptor$._serialized_options = $serialized_value$\n"
             ,(char (*) [11])0x4488a1,&local_c8,(char (*) [17])"serialized_value",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
LAB_002905e3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Generator::FixOptionsForField(const FieldDescriptor& field) const {
  std::string field_options = OptionsValue(field.options().SerializeAsString());
  if (field_options != "None") {
    std::string field_name;
    if (field.is_extension()) {
      if (field.extension_scope() == nullptr) {
        // Top level extensions.
        field_name = field.name();
      } else {
        field_name = FieldReferencingExpression(field.extension_scope(), field,
                                                "extensions_by_name");
      }
    } else {
      field_name = FieldReferencingExpression(field.containing_type(), field,
                                              "fields_by_name");
    }
    PrintDescriptorOptionsFixingCode(field_name, field_options, printer_);
  }
}